

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

bool sf::Shader::isGeometryAvailable(void)

{
  bool bVar1;
  TransientContextLock contextLock;
  Lock lock;
  TransientContextLock local_11;
  Lock local_10;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::isAvailableMutex);
  if (isGeometryAvailable()::checked == '\0') {
    isGeometryAvailable()::checked = '\x01';
    GlResource::TransientContextLock::TransientContextLock(&local_11);
    priv::ensureExtensionsInit();
    bVar1 = isAvailable();
    isGeometryAvailable::available =
         bVar1 && (SF_GLAD_GL_VERSION_3_2 != 0 || SF_GLAD_GL_ARB_geometry_shader4 != 0);
    GlResource::TransientContextLock::~TransientContextLock(&local_11);
  }
  bVar1 = isGeometryAvailable::available;
  Lock::~Lock(&local_10);
  return bVar1;
}

Assistant:

bool Shader::isGeometryAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = isAvailable() && (GLEXT_geometry_shader4 || GLEXT_GL_VERSION_3_2);
    }

    return available;
}